

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O3

int h_scroll_left_proc(Am_Object *self)

{
  float fVar1;
  Am_Widget_Look AVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Widget_Look look;
  Am_Object group;
  Am_Widget_Look local_24;
  Am_Object local_20;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  iVar3 = get_scroll_border_thickness(&local_20);
  pAVar5 = Am_Object::Get(self,0x17f,0);
  local_24.value = Am_MOTIF_LOOK_val;
  if ((pAVar5->type != 1) && (pAVar5->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&local_24,pAVar5);
  }
  AVar2.value = Am_MOTIF_LOOK.value;
  fVar1 = (pAVar5->value).float_value;
  local_24.value = (Am_Widget_Look_vals)fVar1;
  pAVar5 = Am_Object::Get(&local_20,0x1bf,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::~Am_Object(&local_20);
  return ((uint)((float)AVar2.value != fVar1) * 2 - iVar3) + iVar4 + -2;
}

Assistant:

Am_Define_Formula(int, h_scroll_left)
{
  Am_Object group = self.Get_Owner();
  int group_border = get_scroll_border_thickness(group);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int scroll_border = (look == Am_MOTIF_LOOK) ? 2 : 0;
  return (int)group.Get(Am_CLIP_LEFT) - scroll_border - group_border;
}